

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void Rml::Parse::Multiply(DataParser *parser)

{
  DataParser *this;
  Variant local_38;
  DataParser *local_10;
  DataParser *parser_local;
  
  local_10 = parser;
  DataParser::Match(parser,'*',true);
  DataParser::Push(local_10);
  Factor(local_10);
  DataParser::Pop(local_10,L);
  this = local_10;
  Variant::Variant(&local_38);
  DataParser::Emit(this,Multiply,&local_38);
  Variant::~Variant(&local_38);
  return;
}

Assistant:

static void Multiply(DataParser& parser)
	{
		parser.Match('*');
		parser.Push();
		Factor(parser);
		parser.Pop(Register::L);
		parser.Emit(Instruction::Multiply);
	}